

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall
wabt::WastLexer::TextToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,size_t offset)

{
  Location loc;
  string_view text;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  GetLocation(this);
  text._M_len = (long)this->cursor_ - (long)(this->token_start_ + offset);
  loc.filename._M_str = (char *)uStack_40;
  loc.filename._M_len = local_48;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_38;
  loc.field_1._8_8_ = uStack_30;
  text._M_str = this->token_start_ + offset;
  Token::Token(__return_storage_ptr__,loc,token_type,text);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::TextToken(TokenType token_type, size_t offset) {
  return Token(GetLocation(), token_type, GetText(offset));
}